

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

char * compression_name(int compression)

{
  long lVar1;
  long lVar2;
  
  lVar1 = 0;
  do {
    lVar2 = lVar1;
    if (lVar2 + 0x10 == 0x1b0) {
      return "??";
    }
    lVar1 = lVar2 + 0x10;
  } while (*(int *)((long)&compression_methods[0].id + lVar2) != compression);
  return *(char **)((long)&compression_methods[0].name + lVar2);
}

Assistant:

static const char *
compression_name(const int compression)
{
	static const int num_compression_methods =
		sizeof(compression_methods)/sizeof(compression_methods[0]);
	int i=0;

	while(compression >= 0 && i < num_compression_methods) {
		if (compression_methods[i].id == compression)
			return compression_methods[i].name;
		i++;
	}
	return "??";
}